

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O2

void __thiscall ycqian::thread_pool::~thread_pool(thread_pool *this)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)
            (this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    ((this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->shutdown = true;
    pthread_mutex_unlock(__mutex);
    std::condition_variable::notify_all();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->data_).
              super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

~thread_pool(){
            if (data_) {
                {
                    std::lock_guard<std::mutex> lg(data_->mutex);
                    data_->shutdown = true;
                }
                data_->cv.notify_all();
            }
        }